

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O1

void PushIdentityTable(int slot)

{
  uint uVar1;
  FRemapTable *this;
  
  this = (FRemapTable *)operator_new(0x20);
  this->Inactive = false;
  FRemapTable::Alloc(this,0x100);
  FRemapTable::MakeIdentity(this);
  TArray<FRemapTablePtr,_FRemapTable_*>::Grow
            (&translationtables[(uint)slot].super_TArray<FRemapTablePtr,_FRemapTable_*>,1);
  uVar1 = translationtables[(uint)slot].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count;
  translationtables[(uint)slot].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[uVar1].Ptr = this;
  translationtables[(uint)slot].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count = uVar1 + 1;
  return;
}

Assistant:

static void PushIdentityTable(int slot)
{
	FRemapTable *table = new FRemapTable;
	table->MakeIdentity();
	translationtables[slot].Push(table);
}